

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeCall(TranslateToFuzzReader *this,Type type)

{
  long lVar1;
  long lVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  bool bVar4;
  value_type *pvVar5;
  uintptr_t *puVar6;
  Call *pCVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  uintptr_t extraout_RDX_01;
  int iVar8;
  byte bVar9;
  Function *pFVar10;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  undefined8 uStack_98;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  Expression *local_78;
  Function *local_70;
  Builder *local_68;
  Random *local_60;
  undefined1 local_58 [8];
  Iterator __begin2;
  Call *local_38;
  
  iVar8 = (this->fuzzParams->super_FuzzParams).TRIES;
  local_60 = &this->random;
  local_68 = &this->builder;
  do {
    if (iVar8 < 1) {
      pCVar7 = (Call *)makeTrivial(this,type);
      return (Expression *)pCVar7;
    }
    pFVar10 = this->funcContext->func;
    lVar1 = *(long *)(this->wasm + 0x18);
    lVar2 = *(long *)(this->wasm + 0x20);
    if ((lVar1 != lVar2) &&
       (bVar4 = Random::oneIn(local_60,(uint32_t)((ulong)(lVar2 - lVar1) >> 3)), !bVar4)) {
      pvVar5 = Random::
               pick<std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>
                         (local_60,(vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    *)(this->wasm + 0x18));
      pFVar10 = (pvVar5->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ = iVar8
    ;
    if ((type.id == 1) && (((byte)this->wasm[0x178] & 0x80) != 0)) {
      wasm::HeapType::getSignature();
      wasm::HeapType::getSignature();
      bVar4 = extraout_RDX == extraout_RDX_00;
    }
    else {
      bVar4 = false;
    }
    local_70 = pFVar10;
    wasm::HeapType::getSignature();
    bVar9 = extraout_RDX_01 == type.id | bVar4;
    if (bVar9 == 1) {
      uStack_98 = 0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)wasm::HeapType::getSignature();
      local_58 = (undefined1  [8])
                 &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar11 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               Type::end((Type *)local_58);
      for (; PVar3.index = (size_t)__begin2.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar3.parent = (Type *)local_58, PVar11 != PVar3;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        puVar6 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
        local_78 = make(this,(Type)*puVar6);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&uStack_98,
                   &local_78);
      }
      local_38 = Builder::makeCall(local_68,(Name)(local_70->super_Importable).super_Named.name.
                                                  super_IString.str,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&uStack_98,type,bVar4);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&uStack_98
                );
    }
    iVar8 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_
            + -1;
  } while (bVar9 == 0);
  return (Expression *)local_38;
}

Assistant:

Expression* TranslateToFuzzReader::makeCall(Type type) {
  int tries = fuzzParams->TRIES;
  bool isReturn;
  while (tries-- > 0) {
    Function* target = funcContext->func;
    if (!wasm.functions.empty() && !oneIn(wasm.functions.size())) {
      target = pick(wasm.functions).get();
    }
    isReturn = type == Type::unreachable && wasm.features.hasTailCall() &&
               funcContext->func->getResults() == target->getResults();
    if (target->getResults() != type && !isReturn) {
      continue;
    }
    // we found one!
    std::vector<Expression*> args;
    for (const auto& argType : target->getParams()) {
      args.push_back(make(argType));
    }
    return builder.makeCall(target->name, args, type, isReturn);
  }
  // we failed to find something
  return makeTrivial(type);
}